

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

void __thiscall
HighsSplitDeque::HighsSplitDeque
          (HighsSplitDeque *this,shared_ptr<WorkerBunk> *workerBunk,
          unique_ptr<HighsSplitDeque> *workers,int ownerId,int numWorkers)

{
  undefined4 in_ECX;
  __int_type_conflict in_RDX;
  StealerData *in_RDI;
  undefined4 in_R8D;
  StealerData *this_00;
  memory_order in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 __i;
  atomic<bool> *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  OwnerData::OwnerData((OwnerData *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  __i = (undefined1)((uint)in_stack_ffffffffffffffd4 >> 0x18);
  StealerData::StealerData(this_00);
  WorkerBunkData::WorkerBunkData((WorkerBunkData *)0x4b9547);
  *(undefined4 *)
   ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI[1].injectedTask)->_M_pi + 4) =
       in_ECX;
  (in_RDI->ts).super___atomic_base<unsigned_long>._M_i = in_RDX;
  *(undefined4 *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI[1].injectedTask)->_M_pi =
       in_R8D;
  *(undefined4 *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI[6].injectedTask)->_M_pi =
       in_ECX;
  HighsRandom::initialise((HighsRandom *)this_00,(HighsUInt)((ulong)in_RDI >> 0x20));
  std::shared_ptr<HighsSplitDeque::WorkerBunk>::operator=
            ((shared_ptr<HighsSplitDeque::WorkerBunk> *)this_00,
             (shared_ptr<HighsSplitDeque::WorkerBunk> *)in_RDI);
  std::atomic<bool>::store(in_stack_ffffffffffffffd8,(bool)__i,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

HighsSplitDeque(const cache_aligned::shared_ptr<WorkerBunk>& workerBunk,
                  cache_aligned::unique_ptr<HighsSplitDeque>* workers,
                  int ownerId, int numWorkers) {
    ownerData.ownerId = ownerId;
    ownerData.workers = workers;
    ownerData.numWorkers = numWorkers;
    workerBunkData.ownerId = ownerId;
    ownerData.randgen.initialise(ownerId);
    ownerData.workerBunk = workerBunk;
    splitRequest.store(false, std::memory_order_relaxed);

    assert((reinterpret_cast<uintptr_t>(this) & 63u) == 0);
    static_assert(offsetof(HighsSplitDeque, splitRequest) == 64,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, stealerData) == 128,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, workerBunkData) == 192,
                  "alignas failed to guarantee 64 byte alignment");
    static_assert(offsetof(HighsSplitDeque, taskArray) == 256,
                  "alignas failed to guarantee 64 byte alignment");
  }